

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O1

void libcmselect_init_sel_item(_select_item *sel_item)

{
  sel_item->add_select = libcmselect_LTX_add_select;
  sel_item->remove_select = libcmselect_LTX_remove_select;
  sel_item->write_select = libcmselect_LTX_write_select;
  sel_item->add_periodic = libcmselect_LTX_add_periodic;
  sel_item->add_delayed_task = libcmselect_LTX_add_delayed_task;
  sel_item->remove_periodic = libcmselect_LTX_remove_periodic;
  sel_item->wake_function = libcmselect_LTX_wake_function;
  sel_item->blocking_function = libcmselect_LTX_blocking_function;
  sel_item->polling_function = libcmselect_LTX_polling_function;
  sel_item->initialize = libcmselect_LTX_select_initialize;
  sel_item->shutdown = libcmselect_LTX_select_shutdown;
  sel_item->free = libcmselect_LTX_select_free;
  sel_item->stop = libcmselect_LTX_select_stop;
  return;
}

Assistant:

extern void
libcmselect_init_sel_item(struct _select_item *sel_item)
{
    sel_item->add_select = (CMAddSelectFunc)libcmselect_LTX_add_select;
    sel_item->remove_select = (CMRemoveSelectFunc)libcmselect_LTX_remove_select;
    sel_item->write_select = (CMAddSelectFunc) libcmselect_LTX_write_select;
    sel_item->add_periodic = (CMAddPeriodicFunc)libcmselect_LTX_add_periodic;
    sel_item->add_delayed_task = 
	 (CMAddPeriodicFunc)libcmselect_LTX_add_delayed_task;
    sel_item->remove_periodic = (CMRemovePeriodicFunc)libcmselect_LTX_remove_periodic;
    sel_item->wake_function = (CMWakeSelectFunc)libcmselect_LTX_wake_function;
    sel_item->blocking_function = (CMPollFunc)libcmselect_LTX_blocking_function;
    sel_item->polling_function =  (CMPollFunc)libcmselect_LTX_polling_function;
    sel_item->initialize = (SelectInitFunc)libcmselect_LTX_select_initialize;
    sel_item->shutdown = (SelectInitFunc) libcmselect_LTX_select_shutdown;
    sel_item->free = (SelectInitFunc) libcmselect_LTX_select_free;
    sel_item->stop = (CMWakeSelectFunc) libcmselect_LTX_select_stop;
}